

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O1

void __thiscall IntVar::specialiseToLL(IntVar *this)

{
  Tint *pTVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  vec<int> *in_RSI;
  IntVarEL *this_00;
  ulong uVar10;
  vec<int> vStack_48;
  TrailElem TStack_38;
  IntVar *pIStack_28;
  
  this_00 = (IntVarEL *)this;
  iVar7 = (*(this->super_Var).super_Branching._vptr_Branching[3])();
  if ((iVar7 != 4) && (iVar7 != 2)) {
    if (iVar7 == 1) {
      IntVarLL::IntVarLL((IntVarLL *)this,this);
      return;
    }
    specialiseToLL();
    pIStack_28 = this;
    iVar7 = (*(this_00->super_IntVar).super_Var.super_Branching._vptr_Branching[3])();
    if ((iVar7 != 2) &&
       (iVar7 = (*(this_00->super_IntVar).super_Var.super_Branching._vptr_Branching[3])(this_00),
       iVar7 != 4)) {
      vec<int>::vec<int>(&vStack_48,in_RSI);
      piVar6 = vStack_48.data;
      uVar9 = (ulong)vStack_48.sz;
      if (uVar9 != 0) {
        piVar2 = vStack_48.data + uVar9;
        lVar5 = 0x3f;
        if (uVar9 != 0) {
          for (; vStack_48.sz >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (vStack_48.data,piVar2,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar6,piVar2);
      }
      if (vStack_48.sz == 0) {
        uVar8 = 0;
      }
      else {
        uVar9 = 0;
        uVar8 = 0;
        do {
          if ((uVar9 == 0) || (vStack_48.data[uVar9] != vStack_48.data[uVar9 - 1])) {
            uVar10 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
            vStack_48.data[uVar10] = vStack_48.data[uVar9];
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < vStack_48.sz);
      }
      iVar7 = (this_00->super_IntVar).min.v;
      iVar3 = *vStack_48.data;
      vStack_48.sz = uVar8;
      if (iVar7 < iVar3) {
        pTVar1 = &(this_00->super_IntVar).min;
        TStack_38.sz = 4;
        TStack_38.pt = &pTVar1->v;
        TStack_38.x = iVar7;
        vec<TrailElem>::push(&engine.trail,&TStack_38);
        pTVar1->v = iVar3;
      }
      iVar7 = (this_00->super_IntVar).max.v;
      iVar3 = vStack_48.data[vStack_48.sz - 1];
      if (iVar3 < iVar7) {
        pTVar1 = &(this_00->super_IntVar).max;
        TStack_38.sz = 4;
        TStack_38.pt = &pTVar1->v;
        TStack_38.x = iVar7;
        vec<TrailElem>::push(&engine.trail,&TStack_38);
        pTVar1->v = iVar3;
      }
      iVar7 = -1;
      uVar8 = vStack_48.sz;
      if (vStack_48.sz != 0) {
        do {
          iVar7 = iVar7 + 1;
          bVar4 = 1 < uVar8;
          uVar8 = (int)uVar8 >> 1;
        } while (bVar4);
      }
      if (vStack_48.data[vStack_48.sz - 1] - *vStack_48.data < (int)(iVar7 * vStack_48.sz)) {
        IntVarEL::IntVarEL(this_00,&this_00->super_IntVar);
        iVar7 = (*(this_00->super_IntVar).super_Var.super_Branching._vptr_Branching[0x12])
                          (this_00,&vStack_48,0,1);
        if ((char)iVar7 == '\0') {
          puts("=====UNSATISFIABLE=====");
          printf("%% Top level failure!\n");
          exit(0);
        }
      }
      else {
        IntVarSL::IntVarSL((IntVarSL *)this_00,&this_00->super_IntVar,&vStack_48);
      }
      if (vStack_48.data != (int *)0x0) {
        free(vStack_48.data);
      }
    }
    return;
  }
  return;
}

Assistant:

void IntVar::specialiseToLL() {
	switch (getType()) {
		case INT_VAR_EL:
		case INT_VAR_SL:
			return;
		case INT_VAR:
			new (this) IntVarLL(*((IntVar*)this));
			break;
		default:
			NEVER;
	}
}